

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swin_block.h
# Opt level: O3

void __thiscall
shift_window_transformer::SwinBlock<float>::forward
          (SwinBlock<float> *this,Tensor<float> *input,Tensor<float> *output)

{
  Tensor<float> tmp;
  void *local_48;
  undefined8 uStack_40;
  long local_38;
  void *pvStack_30;
  undefined8 local_28;
  long lStack_20;
  
  local_28 = 0;
  lStack_20 = 0;
  local_38 = 0;
  pvStack_30 = (void *)0x0;
  local_48 = (void *)0x0;
  uStack_40 = 0;
  (*(code *)**(undefined8 **)this->residual1)();
  (*(code *)**(undefined8 **)this->residual2)(this->residual2,&local_48,output);
  if (pvStack_30 != (void *)0x0) {
    operator_delete(pvStack_30,lStack_20 - (long)pvStack_30);
  }
  if (local_48 != (void *)0x0) {
    operator_delete(local_48,local_38 - (long)local_48);
  }
  return;
}

Assistant:

void forward(const Tensor<T> &input, Tensor<T> &output) {
            Tensor<T> tmp{};
            residual1->forward(input, tmp);
            residual2->forward(tmp, output);
        }